

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa_io.c
# Opt level: O0

int IDAGetAdjDataPointPolynomial(void *ida_mem,int which,sunrealtype *t,int *order,N_Vector y)

{
  IDAdtpntMemRec **ppIVar1;
  undefined8 *puVar2;
  undefined4 *in_RCX;
  sunrealtype *in_RDX;
  int in_ESI;
  IDAMem in_RDI;
  long in_R8;
  IDApolynomialDataMem content;
  IDAdtpntMem *dt_mem;
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x32e,"IDAGetAdjDataPointPolynomial",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_RDI->ida_adjMallocDone == 0) {
    IDAProcessError(in_RDI,-0x65,0x337,"IDAGetAdjDataPointPolynomial",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa_io.c"
                    ,"Illegal attempt to call before calling IDAadjInit.");
    local_4 = -0x65;
  }
  else {
    ppIVar1 = in_RDI->ida_adj_mem->dt_mem;
    if (in_RDI->ida_adj_mem->ia_interpType == 2) {
      *in_RDX = ppIVar1[in_ESI]->t;
      puVar2 = (undefined8 *)ppIVar1[in_ESI]->content;
      if (in_R8 != 0) {
        N_VScale(0x3ff0000000000000,*puVar2,in_R8);
      }
      *in_RCX = *(undefined4 *)(puVar2 + 4);
      local_4 = 0;
    }
    else {
      IDAProcessError(in_RDI,-0x16,0x341,"IDAGetAdjDataPointPolynomial",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idaa_io.c"
                      ,"This function cannot be called for the specified interp type.");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int IDAGetAdjDataPointPolynomial(void* ida_mem, int which, sunrealtype* t,
                                 int* order, N_Vector y)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDAdtpntMem* dt_mem;
  IDApolynomialDataMem content;
  /* Is ida_mem valid? */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSGAM_NULL_IDAMEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Is ASA initialized? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDA_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSGAM_NO_ADJ);
    return (IDA_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  dt_mem = IDAADJ_mem->dt_mem;

  if (IDAADJ_mem->ia_interpType != IDA_POLYNOMIAL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSGAM_WRONG_INTERP);
    return (IDA_ILL_INPUT);
  }

  *t      = dt_mem[which]->t;
  content = (IDApolynomialDataMem)dt_mem[which]->content;

  if (y != NULL) { N_VScale(ONE, content->y, y); }

  *order = content->order;

  return (IDA_SUCCESS);
}